

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O0

void __thiscall Analyser::initializeVariable(Analyser *this,char type)

{
  Instruction local_24;
  char local_11;
  Analyser *pAStack_10;
  char type_local;
  Analyser *this_local;
  
  if (type == 'i') {
    local_11 = type;
    pAStack_10 = this;
    Instruction::Instruction(&local_24,ipush,0);
    addInstruction(this,&local_24);
  }
  return;
}

Assistant:

void Analyser::initializeVariable(char type) {
	switch (type)
	{
	case 'i':
		addInstruction(Instruction(Operation::ipush, 0));
		break;
	default:
		break;
	}
}